

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.c
# Opt level: O0

int nn_port_resolve(char *port,size_t portlen)

{
  size_t i;
  int res;
  size_t portlen_local;
  char *port_local;
  int local_4;
  
  res = 0;
  i = 0;
  while( true ) {
    if (i == portlen) {
      if (res == 0) {
        local_4 = -0x16;
      }
      else {
        local_4 = res;
      }
      return local_4;
    }
    if ((port[i] < '0') || ('9' < port[i])) break;
    res = port[i] + -0x30 + res * 10;
    if (0xffff < res) {
      return -0x16;
    }
    i = i + 1;
  }
  return -0x16;
}

Assistant:

int nn_port_resolve (const char *port, size_t portlen)
{
    int res;
    size_t i;

    res = 0;
    for (i = 0; i != portlen; ++i) {
        if (port [i] < '0' || port [i] > '9')
            return -EINVAL;
        res *= 10;
        res += port [i] - '0';
        if (res > 0xffff)
            return -EINVAL;
    }

    /*  Port 0 has special meaning (assign an ephemeral port to the socket),
        thus it is illegal to use it in the connection string. */
    if (res == 0)
        return -EINVAL;

    return res;
}